

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_table.c
# Opt level: O0

llmsset_t llmsset_create(size_t initial_size,size_t max_size)

{
  FILE *pFVar1;
  llmsset_t dbs_00;
  int *piVar2;
  char *pcVar3;
  uint64_t *puVar4;
  uint8_t *puVar5;
  llmsset_t dbs;
  size_t max_size_local;
  size_t initial_size_local;
  
  dbs_00 = (llmsset_t)alloc_aligned(0x70);
  pFVar1 = _stderr;
  if (dbs_00 == (llmsset_t)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(pFVar1,"llmsset_create: Unable to allocate memory: %s!\n",pcVar3);
    exit(1);
  }
  if ((int)POPCOUNT(initial_size) != 1) {
    fprintf(_stderr,"llmsset_create: initial_size is not a power of 2!\n");
    exit(1);
  }
  if ((int)POPCOUNT(max_size) != 1) {
    fprintf(_stderr,"llmsset_create: max_size is not a power of 2!\n");
    exit(1);
  }
  if (max_size < initial_size) {
    fprintf(_stderr,"llmsset_create: initial_size > max_size!\n");
    exit(1);
  }
  if (initial_size < 0x200) {
    fprintf(_stderr,"llmsset_create: initial_size too small!\n");
    exit(1);
  }
  dbs_00->max_size = max_size;
  llmsset_set_size(dbs_00,initial_size);
  puVar4 = (uint64_t *)alloc_aligned(dbs_00->max_size << 3);
  dbs_00->table = puVar4;
  puVar5 = (uint8_t *)alloc_aligned(dbs_00->max_size << 4);
  dbs_00->data = puVar5;
  puVar4 = (uint64_t *)alloc_aligned(dbs_00->max_size >> 0xc);
  dbs_00->bitmap1 = puVar4;
  puVar4 = (uint64_t *)alloc_aligned(dbs_00->max_size >> 3);
  dbs_00->bitmap2 = puVar4;
  puVar4 = (uint64_t *)alloc_aligned(dbs_00->max_size >> 3);
  dbs_00->bitmapc = puVar4;
  pFVar1 = _stderr;
  if ((((dbs_00->table != (uint64_t *)0x0) && (dbs_00->data != (uint8_t *)0x0)) &&
      (dbs_00->bitmap1 != (uint64_t *)0x0)) &&
     ((dbs_00->bitmap2 != (uint64_t *)0x0 && (dbs_00->bitmapc != (uint64_t *)0x0)))) {
    LOCK();
    *dbs_00->bitmap2 = 0xc000000000000000;
    UNLOCK();
    dbs_00->hash_cb = (llmsset_hash_cb)0x0;
    dbs_00->equals_cb = (llmsset_equals_cb)0x0;
    dbs_00->create_cb = (llmsset_create_cb)0x0;
    dbs_00->destroy_cb = (llmsset_destroy_cb)0x0;
    llmsset_reset_region_TOGETHER();
    sylvan_init_hash();
    return dbs_00;
  }
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  fprintf(pFVar1,"llmsset_create: Unable to allocate memory: %s!\n",pcVar3);
  exit(1);
}

Assistant:

llmsset_t
llmsset_create(size_t initial_size, size_t max_size)
{
    llmsset_t dbs = alloc_aligned(sizeof(struct llmsset));
    if (dbs == 0) {
        fprintf(stderr, "llmsset_create: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }

#if LLMSSET_MASK
    /* Check if initial_size and max_size are powers of 2 */
    if (__builtin_popcountll(initial_size) != 1) {
        fprintf(stderr, "llmsset_create: initial_size is not a power of 2!\n");
        exit(1);
    }

    if (__builtin_popcountll(max_size) != 1) {
        fprintf(stderr, "llmsset_create: max_size is not a power of 2!\n");
        exit(1);
    }
#endif

    if (initial_size > max_size) {
        fprintf(stderr, "llmsset_create: initial_size > max_size!\n");
        exit(1);
    }

    // minimum size is now 512 buckets (region size, but of course, n_workers * 512 is suggested as minimum)

    if (initial_size < 512) {
        fprintf(stderr, "llmsset_create: initial_size too small!\n");
        exit(1);
    }

    dbs->max_size = max_size;
    llmsset_set_size(dbs, initial_size);

    /* This implementation of "resizable hash table" allocates the max_size table in virtual memory,
       but only uses the "actual size" part in real memory */

    dbs->table = (_Atomic(uint64_t)*) alloc_aligned(dbs->max_size * 8);
    dbs->data = (uint8_t*) alloc_aligned(dbs->max_size * 16);

    /* Also allocate bitmaps. Each region is 64*8 = 512 buckets.
       Overhead of bitmap1: 1 bit per 4096 bucket.
       Overhead of bitmap2: 1 bit per bucket.
       Overhead of bitmapc: 1 bit per bucket. */

    dbs->bitmap1 = (_Atomic(uint64_t)*)alloc_aligned(dbs->max_size / (512*8));
    dbs->bitmap2 = (_Atomic(uint64_t)*)alloc_aligned(dbs->max_size / 8);
    dbs->bitmapc = (uint64_t*)alloc_aligned(dbs->max_size / 8);

    if (dbs->table == 0 || dbs->data == 0 || dbs->bitmap1 == 0 || dbs->bitmap2 == 0 || dbs->bitmapc == 0) {
        fprintf(stderr, "llmsset_create: Unable to allocate memory: %s!\n", strerror(errno));
        exit(1);
    }

#if defined(madvise) && defined(MADV_RANDOM)
    madvise(dbs->table, dbs->max_size * 8, MADV_RANDOM);
#endif

    // forbid first two positions (index 0 and 1)
    dbs->bitmap2[0] = 0xc000000000000000LL;

    dbs->hash_cb = NULL;
    dbs->equals_cb = NULL;
    dbs->create_cb = NULL;
    dbs->destroy_cb = NULL;

    // yes, ugly. for now, we use a global thread-local value.
    // that is a problem with multiple tables.
    // so, for now, do NOT use multiple tables!!

    INIT_THREAD_LOCAL(my_region);
    TOGETHER(llmsset_reset_region);

    // initialize hashtab
    sylvan_init_hash();

    return dbs;
}